

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void printCsvResult(Statement *query,ostream *stream,bool isFirstRow,bool clip)

{
  int32_t iVar1;
  char *pcVar2;
  ostream *poVar3;
  void *pvVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  Column local_1c8;
  byte local_1a9;
  Column local_1a8;
  Column local_190;
  byte local_171;
  Column local_170;
  byte local_151;
  Column local_150;
  Column local_138;
  byte local_119;
  Column local_118;
  Column local_100;
  byte local_e1;
  Column local_e0;
  byte local_c1;
  Column local_c0;
  Column local_a8;
  Column local_90;
  Column local_78;
  Column local_60;
  Column local_38;
  byte local_1a;
  undefined1 local_19;
  bool clip_local;
  ostream *poStack_18;
  bool isFirstRow_local;
  ostream *stream_local;
  Statement *query_local;
  
  local_1a = clip;
  local_19 = isFirstRow;
  poStack_18 = stream;
  stream_local = (ostream *)query;
  SQLite::Statement::getColumn(&local_38,query,0);
  pcVar2 = SQLite::Column::getText(&local_38,"");
  poVar3 = std::operator<<(stream,pcVar2);
  poVar3 = std::operator<<(poVar3,",");
  SQLite::Statement::getColumn(&local_60,(Statement *)stream_local,1);
  dVar6 = SQLite::Column::getDouble(&local_60);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
  poVar3 = std::operator<<(poVar3,",");
  SQLite::Statement::getColumn(&local_78,(Statement *)stream_local,2);
  dVar6 = SQLite::Column::getDouble(&local_78);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
  poVar3 = std::operator<<(poVar3,",");
  SQLite::Statement::getColumn(&local_90,(Statement *)stream_local,3);
  dVar6 = SQLite::Column::getDouble(&local_90);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
  poVar3 = std::operator<<(poVar3,",");
  SQLite::Statement::getColumn(&local_a8,(Statement *)stream_local,4);
  dVar6 = SQLite::Column::getDouble(&local_a8);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
  std::operator<<(poVar3,",");
  SQLite::Column::~Column(&local_a8);
  SQLite::Column::~Column(&local_90);
  SQLite::Column::~Column(&local_78);
  SQLite::Column::~Column(&local_60);
  SQLite::Column::~Column(&local_38);
  local_c1 = 0;
  local_e1 = 0;
  bVar5 = false;
  if ((local_1a & 1) != 0) {
    SQLite::Statement::getColumn(&local_c0,(Statement *)stream_local,5);
    local_c1 = 1;
    dVar6 = SQLite::Column::getDouble(&local_c0);
    SQLite::Statement::getColumn(&local_e0,(Statement *)stream_local,1);
    local_e1 = 1;
    dVar7 = SQLite::Column::getDouble(&local_e0);
    bVar5 = dVar7 < dVar6;
  }
  if ((local_e1 & 1) != 0) {
    SQLite::Column::~Column(&local_e0);
  }
  if ((local_c1 & 1) != 0) {
    SQLite::Column::~Column(&local_c0);
  }
  poVar3 = poStack_18;
  if (bVar5) {
    SQLite::Statement::getColumn(&local_100,(Statement *)stream_local,1);
    dVar6 = SQLite::Column::getDouble(&local_100);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
    std::operator<<(poVar3,",");
    SQLite::Column::~Column(&local_100);
  }
  else {
    local_119 = 0;
    bVar5 = false;
    if ((local_1a & 1) != 0) {
      SQLite::Statement::getColumn(&local_118,(Statement *)stream_local,5);
      local_119 = 1;
      iVar1 = SQLite::Column::getInt(&local_118);
      bVar5 = iVar1 == 0;
    }
    if ((local_119 & 1) != 0) {
      SQLite::Column::~Column(&local_118);
    }
    poVar3 = poStack_18;
    if (bVar5) {
      std::operator<<(poStack_18,"NaN,");
    }
    else {
      SQLite::Statement::getColumn(&local_138,(Statement *)stream_local,5);
      dVar6 = SQLite::Column::getDouble(&local_138);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,dVar6);
      std::operator<<(poVar3,",");
      SQLite::Column::~Column(&local_138);
    }
  }
  local_151 = 0;
  local_171 = 0;
  bVar5 = false;
  if ((local_1a & 1) != 0) {
    SQLite::Statement::getColumn(&local_150,(Statement *)stream_local,6);
    local_151 = 1;
    dVar6 = SQLite::Column::getDouble(&local_150);
    SQLite::Statement::getColumn(&local_170,(Statement *)stream_local,3);
    local_171 = 1;
    dVar7 = SQLite::Column::getDouble(&local_170);
    bVar5 = dVar7 < dVar6;
  }
  if ((local_171 & 1) != 0) {
    SQLite::Column::~Column(&local_170);
  }
  if ((local_151 & 1) != 0) {
    SQLite::Column::~Column(&local_150);
  }
  poVar3 = poStack_18;
  if (bVar5) {
    SQLite::Statement::getColumn(&local_190,(Statement *)stream_local,3);
    dVar6 = SQLite::Column::getDouble(&local_190);
    pvVar4 = (void *)std::ostream::operator<<(poVar3,dVar6);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    SQLite::Column::~Column(&local_190);
  }
  else {
    local_1a9 = 0;
    bVar5 = false;
    if ((local_1a & 1) != 0) {
      SQLite::Statement::getColumn(&local_1a8,(Statement *)stream_local,6);
      local_1a9 = 1;
      iVar1 = SQLite::Column::getInt(&local_1a8);
      bVar5 = iVar1 == 0;
    }
    if ((local_1a9 & 1) != 0) {
      SQLite::Column::~Column(&local_1a8);
    }
    poVar3 = poStack_18;
    if (bVar5) {
      poVar3 = std::operator<<(poStack_18,"NaN");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      SQLite::Statement::getColumn(&local_1c8,(Statement *)stream_local,6);
      dVar6 = SQLite::Column::getDouble(&local_1c8);
      pvVar4 = (void *)std::ostream::operator<<(poVar3,dVar6);
      std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
      SQLite::Column::~Column(&local_1c8);
    }
  }
  return;
}

Assistant:

void printCsvResult(SQLite::Statement& query, std::ostream& stream, bool isFirstRow, bool clip)
{
    stream << query.getColumn(0).getText()   << ","
           << query.getColumn(1).getDouble() << ","
           << query.getColumn(2).getDouble() << ","
           << query.getColumn(3).getDouble() << ","
           << query.getColumn(4).getDouble() << ",";

    if (clip && query.getColumn(5).getDouble() > query.getColumn(1).getDouble())
    {
        stream << query.getColumn(1).getDouble() << ",";
    }
    else if (clip && query.getColumn(5).getInt() == 0)
    {
        stream << "NaN,";
    }
    else
    {
        stream << query.getColumn(5).getDouble() << ",";
    }

    if (clip && query.getColumn(6).getDouble() > query.getColumn(3).getDouble())
    {
        stream << query.getColumn(3).getDouble() << std::endl;
    }
    else if (clip && query.getColumn(6).getInt() == 0)
    {
        stream << "NaN" << std::endl;
    }
    else
    {
        stream << query.getColumn(6).getDouble() << std::endl;
    }
}